

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_buffered_data.cpp
# Opt level: O1

void __thiscall duckdb::SimpleBufferedData::UnblockSinks(SimpleBufferedData *this)

{
  mutex *__mutex;
  InterruptState *this_00;
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  shared_ptr<duckdb::ClientContext,_true> cc;
  weak_ptr<duckdb::ClientContext,_true> local_38;
  
  weak_ptr<duckdb::ClientContext,_true>::lock(&local_38);
  if ((local_38.internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       != (element_type *)0x0) &&
     ((this->buffered_count).super___atomic_base<unsigned_long>._M_i < this->buffer_size)) {
    __mutex = &(this->super_BufferedData).glock;
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar3 != 0) {
      ::std::__throw_system_error(iVar3);
    }
    do {
      this_00 = (this->blocked_sinks).c.
                super__Deque_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
                _M_impl.super__Deque_impl_data._M_start._M_cur;
      if ((this->blocked_sinks).c.
          super__Deque_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl
          .super__Deque_impl_data._M_finish._M_cur == this_00) break;
      uVar1 = (this->buffered_count).super___atomic_base<unsigned_long>._M_i;
      uVar2 = this->buffer_size;
      if (uVar2 <= uVar1) break;
      InterruptState::Callback(this_00);
      ::std::deque<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>::pop_front
                (&(this->blocked_sinks).c);
    } while (uVar1 < uVar2);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  if (local_38.internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void SimpleBufferedData::UnblockSinks() {
	auto cc = context.lock();
	if (!cc) {
		return;
	}
	(void)cc;

	if (buffered_count >= BufferSize()) {
		return;
	}
	// Reschedule enough blocked sinks to populate the buffer
	lock_guard<mutex> lock(glock);
	while (!blocked_sinks.empty()) {
		auto &blocked_sink = blocked_sinks.front();
		if (buffered_count >= BufferSize()) {
			// We have unblocked enough sinks already
			break;
		}
		blocked_sink.Callback();
		blocked_sinks.pop();
	}
}